

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportFileGenerator::PopulateIncludeDirectoriesInterface
          (cmExportFileGenerator *this,cmTargetExport *tei,PreprocessContext preprocessRule,
          ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *pcVar2;
  pointer pcVar3;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  this_00;
  char *pcVar4;
  ImportPropertyMap *this_01;
  cmExportFileGenerator *this_02;
  size_type sVar5;
  bool bVar6;
  cmLocalGenerator *pcVar7;
  string *psVar8;
  ostream *poVar9;
  mapped_type *pmVar10;
  long lVar11;
  size_t sVar12;
  string *e_1;
  _Alloc_hider in_name;
  char *pcVar13;
  string prepro;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  string exportDirs;
  string local_230;
  char *local_210;
  cmGeneratorTarget *local_208;
  ImportPropertyMap *local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1f8;
  cmExportFileGenerator *local_1f0;
  cmGeneratorExpression ge;
  string dirs;
  cmListFileBacktrace local_1b8;
  string includes;
  ios_base local_138 [264];
  
  local_1f8 = missingTargets;
  if (preprocessRule != InstallInterface) {
    __assert_fail("preprocessRule == cmGeneratorExpression::InstallInterface",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmExportFileGenerator.cxx"
                  ,0x173,
                  "void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(cmTargetExport *, cmGeneratorExpression::PreprocessContext, ImportPropertyMap &, std::vector<std::string> &)"
                 );
  }
  pcVar2 = tei->Target;
  paVar1 = &includes.field_2;
  includes._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&includes,"INTERFACE_INCLUDE_DIRECTORIES","");
  local_210 = cmGeneratorTarget::GetProperty(pcVar2,&includes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includes._M_dataplus._M_p != paVar1) {
    operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
  }
  local_1b8.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_1b8.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmGeneratorExpression::cmGeneratorExpression(&ge,&local_1b8);
  if (local_1b8.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b8.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  cmGeneratorExpression::Preprocess(&dirs,&tei->InterfaceIncludeDirectories,InstallInterface,true);
  (*this->_vptr_cmExportFileGenerator[0x11])(this,&dirs);
  local_1f0 = this;
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
  this_00 = cge;
  pcVar7 = cmGeneratorTarget::GetLocalGenerator(pcVar2);
  includes._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&includes,"","");
  prepro._M_dataplus._M_p = (pointer)&prepro.field_2;
  prepro._M_string_length = 0;
  prepro.field_2._M_local_buf[0] = '\0';
  psVar8 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)
                      this_00._M_t.
                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                      pcVar7,&includes,false,pcVar2,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,&prepro);
  exportDirs._M_dataplus._M_p = (pointer)&exportDirs.field_2;
  pcVar3 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&exportDirs,pcVar3,pcVar3 + psVar8->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prepro._M_dataplus._M_p != &prepro.field_2) {
    operator_delete(prepro._M_dataplus._M_p,
                    CONCAT71(prepro.field_2._M_allocated_capacity._1_7_,
                             prepro.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includes._M_dataplus._M_p != &includes.field_2) {
    operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
  }
  if (*(char *)((long)cge._M_t.
                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl +
               0x130) == '\x01') {
    pcVar7 = cmGeneratorTarget::GetLocalGenerator(pcVar2);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&includes);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&includes,"Target \"",8);
    psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar2);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&includes,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,
               "\" is installed with INCLUDES DESTINATION set to a context sensitive path.  Paths which depend on the configuration, policy values or the link interface are not supported.  Consider using target_include_directories instead."
               ,0xde);
    std::__cxx11::stringbuf::str();
    cmLocalGenerator::IssueMessage(pcVar7,FATAL_ERROR,&prepro);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prepro._M_dataplus._M_p != &prepro.field_2) {
      operator_delete(prepro._M_dataplus._M_p,
                      CONCAT71(prepro.field_2._M_allocated_capacity._1_7_,
                               prepro.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&includes);
    std::ios_base::~ios_base(local_138);
    goto LAB_002e154e;
  }
  if (local_210 == (char *)0x0) {
    if (exportDirs._M_string_length == 0) goto LAB_002e154e;
LAB_002e12ce:
    includes._M_dataplus._M_p = (pointer)0x0;
    includes._M_string_length = 0;
    includes.field_2._M_allocated_capacity = 0;
    local_208 = pcVar2;
    local_200 = properties;
    cmGeneratorExpression::Split
              (&exportDirs,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&includes);
    exportDirs._M_string_length = 0;
    *exportDirs._M_dataplus._M_p = '\0';
    sVar5 = includes._M_string_length;
    if (includes._M_dataplus._M_p != (pointer)includes._M_string_length) {
      in_name = includes._M_dataplus;
      do {
        std::__cxx11::string::append((char *)&exportDirs);
        bVar6 = cmsys::SystemTools::FileIsFullPath((string *)in_name._M_p);
        if (!bVar6) {
          lVar11 = std::__cxx11::string::find(in_name._M_p,0x4aee5d,0);
          if (lVar11 == -1) {
            std::__cxx11::string::append((char *)&exportDirs);
          }
        }
        std::__cxx11::string::_M_append
                  ((char *)&exportDirs,(ulong)(((string *)in_name._M_p)->_M_dataplus)._M_p);
        in_name._M_p = in_name._M_p + 0x20;
      } while (in_name._M_p != (pointer)sVar5);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&includes);
    pcVar4 = local_210;
    pcVar13 = local_210;
    if (local_210 == (char *)0x0) {
      pcVar13 = "";
    }
    includes._M_dataplus._M_p = (pointer)&includes.field_2;
    sVar12 = strlen(pcVar13);
    std::__cxx11::string::_M_construct<char_const*>((string *)&includes,pcVar13,pcVar13 + sVar12);
    pcVar13 = ";";
    if (pcVar4 == (char *)0x0) {
      pcVar13 = "";
    }
    std::operator+(&prepro,pcVar13,&exportDirs);
    this_02 = local_1f0;
    this_01 = local_200;
    pcVar2 = local_208;
    std::__cxx11::string::_M_append((char *)&includes,(ulong)prepro._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prepro._M_dataplus._M_p != &prepro.field_2) {
      operator_delete(prepro._M_dataplus._M_p,
                      CONCAT71(prepro.field_2._M_allocated_capacity._1_7_,
                               prepro.field_2._M_local_buf[0]) + 1);
    }
    cmGeneratorExpression::Preprocess(&prepro,&includes,InstallInterface,true);
    if (prepro._M_string_length != 0) {
      ResolveTargetsInGeneratorExpression(this_02,&prepro,pcVar2,local_1f8);
      paVar1 = &local_230.field_2;
      local_230._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"INTERFACE_INCLUDE_DIRECTORIES","");
      bVar6 = checkInterfaceDirs(&prepro,pcVar2,&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar1) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        local_230._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_230,"INTERFACE_INCLUDE_DIRECTORIES","");
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,&local_230);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar1) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prepro._M_dataplus._M_p != &prepro.field_2) {
      operator_delete(prepro._M_dataplus._M_p,
                      CONCAT71(prepro.field_2._M_allocated_capacity._1_7_,
                               prepro.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    if ((*local_210 != '\0') || (exportDirs._M_string_length != 0)) goto LAB_002e12ce;
    includes._M_dataplus._M_p = (pointer)&includes.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&includes,"INTERFACE_INCLUDE_DIRECTORIES","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](properties,&includes);
    pmVar10->_M_string_length = 0;
    *(pmVar10->_M_dataplus)._M_p = '\0';
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includes._M_dataplus._M_p != &includes.field_2) {
    operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
  }
LAB_002e154e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)exportDirs._M_dataplus._M_p != &exportDirs.field_2) {
    operator_delete(exportDirs._M_dataplus._M_p,exportDirs.field_2._M_allocated_capacity + 1);
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&cge);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dirs._M_dataplus._M_p != &dirs.field_2) {
    operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
  }
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return;
}

Assistant:

void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(
  cmTargetExport* tei, cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties, std::vector<std::string>& missingTargets)
{
  cmGeneratorTarget* target = tei->Target;
  assert(preprocessRule == cmGeneratorExpression::InstallInterface);

  const char* propName = "INTERFACE_INCLUDE_DIRECTORIES";
  const char* input = target->GetProperty(propName);

  cmGeneratorExpression ge;

  std::string dirs = cmGeneratorExpression::Preprocess(
    tei->InterfaceIncludeDirectories, preprocessRule, true);
  this->ReplaceInstallPrefix(dirs);
  std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(dirs);
  std::string exportDirs =
    cge->Evaluate(target->GetLocalGenerator(), "", false, target);

  if (cge->GetHadContextSensitiveCondition()) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Target \"" << target->GetName()
      << "\" is installed with "
         "INCLUDES DESTINATION set to a context sensitive path.  Paths which "
         "depend on the configuration, policy values or the link interface "
         "are "
         "not supported.  Consider using target_include_directories instead.";
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (!input && exportDirs.empty()) {
    return;
  }
  if ((input && !*input) && exportDirs.empty()) {
    // Set to empty
    properties[propName].clear();
    return;
  }

  prefixItems(exportDirs);

  std::string includes = (input ? input : "");
  const char* sep = input ? ";" : "";
  includes += sep + exportDirs;
  std::string prepro =
    cmGeneratorExpression::Preprocess(includes, preprocessRule, true);
  if (!prepro.empty()) {
    this->ResolveTargetsInGeneratorExpressions(prepro, target, missingTargets);

    if (!checkInterfaceDirs(prepro, target, propName)) {
      return;
    }
    properties[propName] = prepro;
  }
}